

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O0

size_t pstore::repo::fragment::size_bytes<pstore::repo::bss_section_creation_dispatcher*>
                 (bss_section_creation_dispatcher *first,bss_section_creation_dispatcher *last)

{
  size_t local_30;
  size_t size_bytes;
  unsigned_long unum_contents;
  difference_type num_contents;
  bss_section_creation_dispatcher *last_local;
  bss_section_creation_dispatcher *first_local;
  
  num_contents = (difference_type)last;
  last_local = first;
  check_range_is_sorted<pstore::repo::bss_section_creation_dispatcher*>(first,last);
  size_bytes = std::distance<pstore::repo::bss_section_creation_dispatcher*>
                         (last_local,(bss_section_creation_dispatcher *)num_contents);
  unum_contents = size_bytes;
  if (-1 < (long)size_bytes) {
    local_30 = section_sparray<unsigned_long>::size_bytes(size_bytes);
    local_30 = local_30 + 0x10;
    std::
    for_each<pstore::repo::bss_section_creation_dispatcher*,pstore::repo::fragment::size_bytes<pstore::repo::bss_section_creation_dispatcher*>(pstore::repo::bss_section_creation_dispatcher*,pstore::repo::bss_section_creation_dispatcher*)::_lambda(pstore::repo::section_creation_dispatcher_const&)_1_>
              (last_local,(bss_section_creation_dispatcher *)num_contents,
               (anon_class_8_1_3266886b)&local_30);
    return local_30;
  }
  assert_failed("num_contents >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/fragment.hpp"
                ,0x1cd);
}

Assistant:

std::size_t fragment::size_bytes (Iterator first, Iterator last) {
            fragment::check_range_is_sorted (first, last);

            auto const num_contents = std::distance (first, last);
            PSTORE_ASSERT (num_contents >= 0);
            auto const unum_contents =
                static_cast<typename std::make_unsigned<decltype (num_contents)>::type> (
                    num_contents);

            // Space needed by the signature and section offset array.
            std::size_t size_bytes =
                offsetof (fragment, arr_) + decltype (fragment::arr_)::size_bytes (unum_contents);
            // Now the storage for each of the contents
            std::for_each (first, last, [&size_bytes] (section_creation_dispatcher const & c) {
                size_bytes = c.aligned (size_bytes);
                size_bytes += c.size_bytes ();
            });
            return size_bytes;
        }